

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

ostream * fasttext::operator<<(ostream *os,Vector *v)

{
  _Setprecision _Var1;
  int64_t iVar2;
  real *prVar3;
  ostream *poVar4;
  ostream *in_RDI;
  int64_t j;
  Vector *this;
  Vector *local_20;
  
  _Var1 = std::setprecision(5);
  std::operator<<(in_RDI,_Var1);
  local_20 = (Vector *)0x0;
  while( true ) {
    this = local_20;
    iVar2 = Vector::size((Vector *)0x1c44b1);
    if (iVar2 <= (long)this) break;
    poVar4 = in_RDI;
    prVar3 = Vector::operator[](this,(int64_t)in_RDI);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*prVar3);
    std::operator<<(poVar4,' ');
    local_20 = (Vector *)((long)&(local_20->data_).mem_ + 1);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Vector& v) {
  os << std::setprecision(5);
  for (int64_t j = 0; j < v.size(); j++) {
    os << v[j] << ' ';
  }
  return os;
}